

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_mul(secp256k1_fe *r,secp256k1_fe *a,secp256k1_fe *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  uint64_t uVar63;
  uint64_t uVar64;
  uint64_t uVar65;
  uint64_t uVar66;
  int iVar67;
  int iVar68;
  ulong uVar69;
  ulong uVar70;
  secp256k1_fe *a_00;
  ulong uVar71;
  ulong uVar72;
  secp256k1_gej *a_01;
  ulong uVar73;
  secp256k1_fe *a_02;
  secp256k1_gej *r_00;
  ulong uVar74;
  undefined1 auVar75 [16];
  
  secp256k1_fe_verify(a);
  secp256k1_fe_verify(b);
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)a->magnitude,8);
  a_02 = (secp256k1_fe *)(ulong)(uint)b->magnitude;
  uVar72 = 8;
  secp256k1_fe_verify_magnitude(a_02,8);
  if (r == b) {
    secp256k1_fe_mul_cold_16();
LAB_0011900e:
    secp256k1_fe_mul_cold_15();
LAB_00119013:
    secp256k1_fe_mul_cold_14();
LAB_00119018:
    secp256k1_fe_mul_cold_13();
LAB_0011901d:
    secp256k1_fe_mul_cold_12();
LAB_00119022:
    secp256k1_fe_mul_cold_11();
LAB_00119027:
    secp256k1_fe_mul_cold_10();
LAB_0011902c:
    secp256k1_fe_mul_cold_9();
LAB_00119031:
    secp256k1_fe_mul_cold_8();
LAB_00119036:
    secp256k1_fe_mul_cold_7();
LAB_0011903b:
    secp256k1_fe_mul_cold_6();
LAB_00119040:
    secp256k1_fe_mul_cold_5();
    auVar75._8_8_ = uVar72;
    auVar75._0_8_ = a_02;
LAB_00119045:
    secp256k1_fe_mul_cold_4();
LAB_0011904a:
    secp256k1_fe_mul_cold_3();
  }
  else {
    if (a == b) goto LAB_0011900e;
    uVar70 = a->n[0];
    if (uVar70 >> 0x38 != 0) goto LAB_00119013;
    uVar71 = a->n[1];
    if (0xffffffffffffff < uVar71) goto LAB_00119018;
    a_02 = (secp256k1_fe *)a->n[2];
    if ((secp256k1_fe *)0xffffffffffffff < a_02) goto LAB_0011901d;
    uVar73 = a->n[3];
    if (0xffffffffffffff < uVar73) goto LAB_00119022;
    uVar72 = a->n[4];
    if (uVar72 >> 0x34 != 0) goto LAB_00119027;
    uVar69 = b->n[0];
    if (0xffffffffffffff < uVar69) goto LAB_0011902c;
    uVar74 = b->n[1];
    if (0xffffffffffffff < uVar74) goto LAB_00119031;
    uVar1 = b->n[2];
    if (0xffffffffffffff < uVar1) goto LAB_00119036;
    uVar2 = b->n[3];
    if (0xffffffffffffff < uVar2) goto LAB_0011903b;
    uVar3 = b->n[4];
    if (0xfffffffffffff < uVar3) goto LAB_00119040;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar2;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar70;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar1;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar71;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar74;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = a_02;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar69;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar73;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar3;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar72;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = SUB168(auVar8 * auVar39,0);
    auVar4 = auVar9 * ZEXT816(0x1000003d10) +
             auVar4 * auVar35 + auVar5 * auVar36 + auVar7 * auVar38 + auVar6 * auVar37;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar3;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar70;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar2;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar71;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar1;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = a_02;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar74;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar73;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar69;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar72;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = SUB168(auVar8 * auVar39,8);
    auVar5 = auVar15 * ZEXT816(0x1000003d10000) +
             auVar10 * auVar40 +
             auVar11 * auVar41 + auVar12 * auVar42 + auVar14 * auVar44 + auVar13 * auVar43 +
             (auVar4 >> 0x34);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar69;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar70;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar3;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar71;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar2;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = a_02;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar1;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar73;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar74;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar72;
    auVar75 = (auVar5 >> 0x34) +
              auVar17 * auVar46 + auVar18 * auVar47 + auVar20 * auVar49 + auVar19 * auVar48;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = auVar75._0_8_ * 0x10 & 0xfffffffffffff0U | (ulong)(auVar5._6_2_ & 0xf);
    auVar6 = auVar21 * ZEXT816(0x1000003d1) + auVar16 * auVar45;
    uVar69 = auVar6._0_8_;
    uVar74 = auVar6._8_8_;
    r->n[0] = uVar69 & 0xfffffffffffff;
    auVar60._8_8_ = uVar74 >> 0x34;
    auVar60._0_8_ = uVar74 * 0x1000 | uVar69 >> 0x34;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar70;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = b->n[1];
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar71;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = b->n[0];
    auVar6 = auVar22 * auVar50 + auVar60 + auVar23 * auVar51;
    if (auVar6._8_8_ >> 0x32 != 0) goto LAB_00119045;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = a_02;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = b->n[4];
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar73;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = b->n[3];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar72;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = b->n[2];
    auVar7 = auVar26 * auVar54 + auVar24 * auVar52 + (auVar75 >> 0x34) + auVar25 * auVar53;
    uVar69 = auVar7._8_8_;
    auVar75._8_8_ = uVar69;
    auVar75._0_8_ = 0xffffffffffffffff;
    if (0x3ffffffffffff < uVar69) goto LAB_0011904a;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
    auVar6 = auVar6 + auVar27 * ZEXT816(0x1000003d10);
    auVar75._0_8_ = r;
    r->n[1] = auVar6._0_8_ & 0xfffffffffffff;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar70;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = b->n[2];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar71;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = b->n[1];
    auVar30._8_8_ = 0;
    auVar30._0_8_ = a_02;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = b->n[0];
    auVar6 = auVar28 * auVar55 + (auVar6 >> 0x34) + auVar29 * auVar56 + auVar30 * auVar57;
    if (auVar6._8_8_ < 0x4000000000000) {
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar73;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = b->n[4];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar72;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = b->n[3];
      auVar7 = auVar31 * auVar58 + (auVar7 >> 0x34) + auVar32 * auVar59;
      uVar72 = auVar7._8_8_;
      auVar75._8_8_ = uVar72;
      if (uVar72 < 0x4000000000000) {
        auVar33._8_8_ = 0;
        auVar33._0_8_ = auVar7._0_8_;
        auVar6 = auVar6 + auVar33 * ZEXT816(0x1000003d10);
        auVar75 = auVar6 >> 0x34;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = auVar75._0_8_;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = uVar72;
        auVar61._8_8_ = auVar75._8_8_;
        auVar61._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
        r->n[2] = auVar6._0_8_ & 0xfffffffffffff;
        auVar62 = auVar34 * ZEXT816(0x1000003d10000) + auVar61 + auVar62;
        uVar72 = auVar62._0_8_;
        r->n[3] = uVar72 & 0xfffffffffffff;
        r->n[4] = (auVar62._8_8_ << 0xc | uVar72 >> 0x34) + (auVar5._0_8_ & 0xffffffffffff);
        r->magnitude = 1;
        r->normalized = 0;
        secp256k1_fe_verify(r);
        return;
      }
      goto LAB_00119054;
    }
  }
  secp256k1_fe_mul_cold_2();
LAB_00119054:
  secp256k1_fe_mul_cold_1();
  a_01 = auVar75._8_8_;
  r_00 = auVar75._0_8_;
  secp256k1_gej_verify(a_01);
  if (a_01->infinity == 0) {
    if (a_00 != (secp256k1_fe *)0x0) {
      uVar63 = (a_01->y).n[0];
      uVar64 = (a_01->y).n[1];
      uVar65 = (a_01->y).n[2];
      uVar66 = (a_01->y).n[3];
      iVar67 = (a_01->y).magnitude;
      iVar68 = (a_01->y).normalized;
      a_00->n[4] = (a_01->y).n[4];
      a_00->magnitude = iVar67;
      a_00->normalized = iVar68;
      a_00->n[2] = uVar65;
      a_00->n[3] = uVar66;
      a_00->n[0] = uVar63;
      a_00->n[1] = uVar64;
      secp256k1_fe_verify(a_00);
      uVar72 = a_00->n[4];
      uVar71 = (uVar72 >> 0x30) * 0x1000003d1 + a_00->n[0];
      uVar70 = (uVar71 >> 0x34) + a_00->n[1];
      uVar73 = (uVar70 >> 0x34) + a_00->n[2];
      uVar69 = (uVar73 >> 0x34) + a_00->n[3];
      a_00->n[0] = uVar71 & 0xfffffffffffff;
      a_00->n[1] = uVar70 & 0xfffffffffffff;
      a_00->n[2] = uVar73 & 0xfffffffffffff;
      a_00->n[3] = uVar69 & 0xfffffffffffff;
      a_00->n[4] = (uVar69 >> 0x34) + (uVar72 & 0xffffffffffff);
      a_00->magnitude = 1;
      secp256k1_fe_verify(a_00);
    }
    secp256k1_gej_double(r_00,a_01);
    secp256k1_gej_verify(r_00);
    return;
  }
  secp256k1_gej_set_infinity(r_00);
  if (a_00 != (secp256k1_fe *)0x0) {
    a_00->n[0] = 1;
    a_00->n[1] = 0;
    a_00->n[2] = 0;
    a_00->n[3] = 0;
    a_00->n[4] = 0;
    a_00->magnitude = 1;
    a_00->normalized = 1;
    secp256k1_fe_verify(a_00);
    return;
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_mul(secp256k1_fe *r, const secp256k1_fe *a, const secp256k1_fe * SECP256K1_RESTRICT b) {
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY(b);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 8);
    SECP256K1_FE_VERIFY_MAGNITUDE(b, 8);
    VERIFY_CHECK(r != b);
    VERIFY_CHECK(a != b);

    secp256k1_fe_impl_mul(r, a, b);
    r->magnitude = 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}